

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_strings.c
# Opt level: O0

void test_str_strlcpy(CuTest *tc)

{
  size_t sVar1;
  int *piVar2;
  char local_38 [5];
  char local_33;
  char buffer [32];
  CuTest *tc_local;
  
  memset(local_38,0x7f,0x20);
  sVar1 = str_strlcpy((char *)0x0,"herpderp",0);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x78,(char *)0x0,8,(int)sVar1);
  sVar1 = str_strlcpy(local_38,"herp",8);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x79,(char *)0x0,4,(int)sVar1);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x7a,(char *)0x0,"herp",local_38);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x7b,(char *)0x0,0x7f,(int)local_33);
  sVar1 = str_strlcpy(local_38,"herp",4);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x7d,(char *)0x0,4,(int)sVar1);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x7e,(char *)0x0,"her",local_38);
  sVar1 = str_strlcpy(local_38,"herpderp",8);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x80,(char *)0x0,8,(int)sVar1);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x81,(char *)0x0,"herpder",local_38);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x82,(char *)0x0,0x7f,(int)buffer[0]);
  sVar1 = str_strlcpy(local_38,"herpderp",0x10);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x84,(char *)0x0,8,(int)sVar1);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x85,(char *)0x0,"herpderp",local_38);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x86,(char *)0x0,0x7f,(int)buffer[1]);
  piVar2 = __errno_location();
  *piVar2 = 0;
  return;
}

Assistant:

static void test_str_strlcpy(CuTest * tc)
{
    char buffer[32];

    memset(buffer, 0x7f, sizeof(buffer));

    CuAssertIntEquals(tc, 8, (int)str_strlcpy(NULL, "herpderp", 0));
    CuAssertIntEquals(tc, 4, (int)str_strlcpy(buffer, "herp", 8));
    CuAssertStrEquals(tc, "herp", buffer);
    CuAssertIntEquals(tc, 0x7f, buffer[5]);

    CuAssertIntEquals(tc, 4, (int)str_strlcpy(buffer, "herp", 4));
    CuAssertStrEquals(tc, "her", buffer);

    CuAssertIntEquals(tc, 8, (int)str_strlcpy(buffer, "herpderp", 8));
    CuAssertStrEquals(tc, "herpder", buffer);
    CuAssertIntEquals(tc, 0x7f, buffer[8]);

    CuAssertIntEquals(tc, 8, (int)str_strlcpy(buffer, "herpderp", 16));
    CuAssertStrEquals(tc, "herpderp", buffer);
    CuAssertIntEquals(tc, 0x7f, buffer[9]);

    errno = 0;
}